

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ParamListStandard::forceNoUse(ParamListStandard *this,ParamActive *active,int4 start,int4 stop)

{
  pointer pPVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  
  lVar3 = (long)start;
  lVar4 = lVar3 * 0x30;
  iVar7 = -1;
  bVar8 = false;
  uVar5 = 0;
  do {
    if (stop <= lVar3) {
      return;
    }
    pPVar1 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = *(long *)((long)&pPVar1->entry + lVar4);
    uVar6 = uVar5;
    if (lVar2 != 0) {
      if ((iVar7 < *(int *)(lVar2 + 8)) || (*(int *)(lVar2 + 0x28) != 0)) {
        uVar9 = *(uint *)((long)&pPVar1->flags + lVar4);
        uVar6 = uVar9 >> 2 & 0x3f;
        iVar7 = *(int *)(lVar2 + 0xc) + *(int *)(lVar2 + 8) + -1;
        if ((uVar5 & 1) != 0 || bVar8) goto LAB_00292994;
      }
      else {
        uVar9 = *(uint *)((long)&pPVar1->flags + lVar4);
        if ((uVar9 & 4) == 0) {
          uVar5 = 0;
        }
        uVar6 = uVar5;
        if (bVar8) {
LAB_00292994:
          *(uint *)((long)&pPVar1->flags + lVar4) = (uVar9 & 0xfffffff6) + 1;
          bVar8 = true;
          goto LAB_002929a2;
        }
      }
      bVar8 = false;
    }
LAB_002929a2:
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x30;
    uVar5 = uVar6;
  } while( true );
}

Assistant:

void ParamListStandard::forceNoUse(ParamActive *active, int4 start, int4 stop) const

{
  bool seendefnouse = false;
  int4 curgroup = -1;
  bool exclusion = false;
  bool alldefnouse = false;
  for (int4 i = start; i < stop; ++i) {
    ParamTrial &curtrial(active->getTrial(i));
    if (curtrial.getEntry() == (const ParamEntry *) 0)
      continue;	// Already marked as not used
    int4 grp = curtrial.getEntry()->getGroup();
    exclusion = curtrial.getEntry()->isExclusion();
    if ((grp <= curgroup) && exclusion) {// If in the same exclusion group
      if (!curtrial.isDefinitelyNotUsed()) // A single element that might be used
	alldefnouse = false; // means that the whole group might be used
    }
    else { // First trial in a new group (or next element in same non-exclusion group)
      if (alldefnouse)	   // If all in the last group were defnotused
	seendefnouse = true;// then force everything afterword to be defnotused
      alldefnouse = curtrial.isDefinitelyNotUsed();
      curgroup = grp + curtrial.getEntry()->getGroupSize() - 1;
    }
    if (seendefnouse)
      curtrial.markInactive();
  }
}